

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

int ConvexDecomposition::PolyHit
              (float3 *vert,int n,float3 *v0,float3 *v1,float3 *impact,float3 *normal)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  float *pfVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [64];
  
  uVar14 = (ulong)(uint)n;
  countpolyhit = countpolyhit + 1;
  if (n < 1) {
    auVar22 = ZEXT864(0);
    fVar21 = 0.0;
  }
  else {
    pfVar18 = &vert->z;
    auVar22 = ZEXT864(0);
    fVar21 = 0.0;
    uVar17 = 1;
    do {
      uVar4 = (uVar17 + 1 & 0xffffffff) % uVar14;
      uVar16 = 0;
      if (uVar17 != uVar14) {
        uVar16 = uVar17;
      }
      fVar19 = vert[uVar16].x - ((float3 *)(pfVar18 + -2))->x;
      fVar20 = vert[uVar16].y - pfVar18[-1];
      fVar5 = vert[uVar16].z - *pfVar18;
      fVar6 = vert[uVar4].x - vert[uVar16].x;
      fVar7 = vert[uVar4].y - vert[uVar16].y;
      fVar8 = vert[uVar4].z - vert[uVar16].z;
      auVar11 = vfmsub231ss_fma(ZEXT416((uint)(fVar7 * fVar5)),ZEXT416((uint)fVar20),
                                ZEXT416((uint)fVar8));
      auVar12 = vfmsub231ss_fma(ZEXT416((uint)(fVar8 * fVar19)),ZEXT416((uint)fVar6),
                                ZEXT416((uint)fVar5));
      auVar13 = vfmsub231ss_fma(ZEXT416((uint)(fVar6 * fVar20)),ZEXT416((uint)fVar19),
                                ZEXT416((uint)fVar7));
      fVar21 = fVar21 + auVar13._0_4_;
      auVar13 = vmovshdup_avx(auVar22._0_16_);
      auVar13 = vinsertps_avx(ZEXT416((uint)(auVar22._0_4_ + auVar11._0_4_)),
                              ZEXT416((uint)(auVar13._0_4_ + auVar12._0_4_)),0x10);
      auVar22 = ZEXT1664(auVar13);
      pfVar18 = pfVar18 + 3;
      lVar1 = (1 - uVar14) + uVar17;
      uVar17 = uVar17 + 1;
    } while (lVar1 != 1);
  }
  auVar13 = vmovshdup_avx(auVar22._0_16_);
  fVar20 = auVar13._0_4_;
  fVar19 = fVar21 * fVar21 + auVar22._0_4_ * auVar22._0_4_ + fVar20 * fVar20;
  if (fVar19 < 0.0) {
    fVar19 = sqrtf(fVar19);
    auVar22 = ZEXT1664(auVar22._0_16_);
  }
  else {
    auVar13 = vsqrtss_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19));
    fVar19 = auVar13._0_4_;
  }
  uVar15 = 0;
  if ((fVar19 != 0.0) || (NAN(fVar19))) {
    fVar19 = 1.0 / fVar19;
    fVar5 = auVar22._0_4_ * fVar19;
    fVar20 = fVar20 * fVar19;
    fVar21 = fVar21 * fVar19;
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * vert->y)),ZEXT416((uint)fVar5),
                              ZEXT416((uint)vert->x));
    auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar21),ZEXT416((uint)vert->z));
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * v0->y)),ZEXT416((uint)fVar5),
                              ZEXT416((uint)v0->x));
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar21),ZEXT416((uint)v0->z));
    fVar19 = auVar11._0_4_ - auVar13._0_4_;
    if (0.0 <= fVar19) {
      auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * v1->y)),ZEXT416((uint)fVar5),
                                ZEXT416((uint)v1->x));
      auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar21),ZEXT416((uint)v1->z));
      fVar6 = auVar11._0_4_ - auVar13._0_4_;
      if (fVar6 <= 0.0) {
        if (PolyHit(ConvexDecomposition::float3_const*,int,ConvexDecomposition::float3_const&,ConvexDecomposition::float3_const&,ConvexDecomposition::float3*,ConvexDecomposition::float3*)
            ::the_point == '\0') {
          PolyHit();
        }
        fVar19 = fVar19 / (fVar19 - fVar6);
        fVar6 = 1.0 - fVar19;
        PolyHit::the_point.z = fVar6 * v0->z + fVar19 * v1->z;
        auVar13 = vinsertps_avx(ZEXT416((uint)(fVar6 * v0->x + fVar19 * v1->x)),
                                ZEXT416((uint)(fVar6 * v0->y + fVar19 * v1->y)),0x10);
        PolyHit::the_point._0_8_ = vmovlps_avx(auVar13);
        if (n < 1) {
          bVar3 = true;
          uVar15 = 1;
        }
        else {
          pfVar18 = &vert->z;
          uVar17 = 1;
          do {
            uVar4 = (uVar17 & 0xffffffff) % uVar14;
            fVar19 = vert[uVar4].x - ((float3 *)(pfVar18 + -2))->x;
            fVar6 = vert[uVar4].y - pfVar18[-1];
            fVar7 = vert[uVar4].z - *pfVar18;
            fVar8 = PolyHit::the_point.x - ((float3 *)(pfVar18 + -2))->x;
            fVar9 = PolyHit::the_point.y - pfVar18[-1];
            fVar10 = PolyHit::the_point.z - *pfVar18;
            auVar13 = vfmsub231ss_fma(ZEXT416((uint)(fVar7 * fVar9)),ZEXT416((uint)fVar6),
                                      ZEXT416((uint)fVar10));
            auVar11 = vfmsub231ss_fma(ZEXT416((uint)(fVar10 * fVar19)),ZEXT416((uint)fVar8),
                                      ZEXT416((uint)fVar7));
            auVar12 = vfmsub231ss_fma(ZEXT416((uint)(fVar6 * fVar8)),ZEXT416((uint)fVar19),
                                      ZEXT416((uint)fVar9));
            auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * auVar11._0_4_)),ZEXT416((uint)fVar5),
                                      auVar13);
            auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar21),auVar12);
            fVar19 = auVar13._0_4_;
            bVar3 = 0.0 <= fVar19;
            if (uVar14 <= uVar17) break;
            pfVar18 = pfVar18 + 3;
            uVar17 = uVar17 + 1;
          } while (0.0 <= fVar19);
          uVar15 = (uint)(0.0 <= fVar19);
        }
        if (bVar3) {
          if (normal != (float3 *)0x0) {
            auVar13 = vinsertps_avx(ZEXT416((uint)fVar5),ZEXT416((uint)fVar20),0x10);
            uVar2 = vmovlps_avx(auVar13);
            normal->x = (float)(int)uVar2;
            normal->y = (float)(int)((ulong)uVar2 >> 0x20);
            normal->z = fVar21;
          }
          if (impact != (float3 *)0x0) {
            impact->z = PolyHit::the_point.z;
            fVar21 = PolyHit::the_point.y;
            impact->x = PolyHit::the_point.x;
            impact->y = fVar21;
          }
        }
      }
    }
  }
  return uVar15;
}

Assistant:

int PolyHit(const float3 *vert, const int n, const float3 &v0, const float3 &v1, float3 *impact, float3 *normal)
{
	countpolyhit++;
	int i;
	float3 nrml(0,0,0);
	for(i=0;i<n;i++) 
		{
		int i1=(i+1)%n;
		int i2=(i+2)%n;
		nrml = nrml + cross(vert[i1]-vert[i],vert[i2]-vert[i1]);
	}

	float m = magnitude(nrml);
	if(m==0.0)
		{
				return 0;
		}
	nrml = nrml * (1.0f/m);
	float dist = -dot(nrml,vert[0]);
	float d0,d1;
	if((d0=dot(v0,nrml)+dist) <0  ||  (d1=dot(v1,nrml)+dist) >0) 
		{        
				return 0;
		}

	static float3 the_point; 
	// By using the cached plane distances d0 and d1
	// we can optimize the following:
	//     the_point = planelineintersection(nrml,dist,v0,v1);
	float a = d0/(d0-d1);
	the_point = v0*(1-a) + v1*a;


	int inside=1;
	for(int j=0;inside && j<n;j++) 
		{
			// let inside = 0 if outside
			float3 pp1,pp2,side;
			pp1 = vert[j] ;
			pp2 = vert[(j+1)%n];
			side = cross((pp2-pp1),(the_point-pp1));
			inside = (dot(nrml,side) >= 0.0);
	}
	if(inside) 
		{
		if(normal){*normal=nrml;}
		if(impact){*impact=the_point;}
	}
	return inside;
}